

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void check_repfnz(int n,int w,int jcol,int *repfnz)

{
  char local_128 [8];
  char msg [256];
  int k;
  int jj;
  int *repfnz_local;
  int jcol_local;
  int w_local;
  int n_local;
  
  for (msg._252_4_ = jcol; (int)msg._252_4_ < jcol + w; msg._252_4_ = msg._252_4_ + 1) {
    msg[0xf8] = '\0';
    msg[0xf9] = '\0';
    msg[0xfa] = '\0';
    msg[0xfb] = '\0';
    for (; (int)msg._248_4_ < n; msg._248_4_ = msg._248_4_ + 1) {
      if (repfnz[(msg._252_4_ - jcol) * n + msg._248_4_] != -1) {
        fprintf(_stderr,"col %d, repfnz_col[%d] = %d\n",(ulong)(uint)msg._252_4_,
                (ulong)(uint)msg._248_4_,(ulong)(uint)repfnz[(msg._252_4_ - jcol) * n + msg._248_4_]
               );
        sprintf(local_128,"%s at line %d in file %s\n","check_repfnz",0x218,
                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/util.c");
        superlu_abort_and_exit(local_128);
      }
    }
  }
  return;
}

Assistant:

void check_repfnz(int n, int w, int jcol, const int *repfnz)
{
    int jj, k;

    for (jj = jcol; jj < jcol+w; jj++) 
	for (k = 0; k < n; k++)
	    if ( repfnz[(jj-jcol)*n + k] != SLU_EMPTY ) {
		fprintf(stderr, "col %d, repfnz_col[%d] = %d\n", jj,
			k, repfnz[(jj-jcol)*n + k]);
		ABORT("check_repfnz");
	    }
}